

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionConstraintSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2)

{
  Token semi;
  Token soft;
  ExpressionConstraintSyntax *pEVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pEVar1 = (ExpressionConstraintSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  soft.info = in_RSI;
  soft.kind = (short)in_RDX;
  soft._2_1_ = (char)((ulong)in_RDX >> 0x10);
  soft.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  soft.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = in_RCX;
  semi._0_8_ = in_RSI->location;
  slang::syntax::ExpressionConstraintSyntax::ExpressionConstraintSyntax
            ((ExpressionConstraintSyntax *)in_RSI->rawTextPtr,soft,
             (ExpressionSyntax *)in_RCX->location,semi);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }